

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Json::Json(Json *this,bool value)

{
  Statics *pSVar1;
  shared_ptr<json11::JsonValue> *local_28;
  bool value_local;
  Json *this_local;
  
  if (value) {
    pSVar1 = statics();
    local_28 = &pSVar1->t;
  }
  else {
    pSVar1 = statics();
    local_28 = &pSVar1->f;
  }
  std::shared_ptr<json11::JsonValue>::shared_ptr(&this->m_ptr,local_28);
  return;
}

Assistant:

Json::Json(bool value)                 : m_ptr(value ? statics().t : statics().f) {}